

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateCacheVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateCacheVkImpl::PipelineStateCacheVkImpl
          (PipelineStateCacheVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,PipelineStateCacheCreateInfo *CreateInfo)

{
  PSO_CACHE_MODE *pPVar1;
  VulkanPhysicalDevice *pVVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  VkPipelineCache_T *pVVar6;
  undefined8 uVar7;
  RenderDeviceVkImpl *pRVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  VkPipelineCacheHeaderVersionOne HeaderVersion;
  VkPipelineCacheCreateInfo VkPipelineStateCacheCI;
  PipelineCacheWrapper local_68;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 *local_28;
  
  PipelineStateCacheBase<Diligent::EngineVkImplTraits>::PipelineStateCacheBase
            (&this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,CreateInfo,false);
  (this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
  .super_ObjectBase<Diligent::IPipelineStateCacheVk>.
  super_RefCountedObject<Diligent::IPipelineStateCacheVk>.super_IPipelineStateCacheVk.
  super_IPipelineStateCache.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00aec7f8;
  (this->m_PipelineStateCache).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->m_PipelineStateCache).m_VkObject = (VkPipelineCache_T *)0x0;
  pPVar1 = &(this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
            .m_Desc.Mode;
  *pPVar1 = *pPVar1 | PSO_CACHE_MODE_LOAD_STORE;
  local_28 = (undefined8 *)0x0;
  local_38 = (undefined1  [16])0x0;
  local_48._4_12_ = SUB1612((undefined1  [16])0x0,4);
  local_48._0_4_ = 0x11;
  if ((CreateInfo->pCacheData != (void *)0x0) && (0x20 < CreateInfo->CacheDataSize)) {
    pRVar8 = DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
                          *)this);
    pVVar2 = (pRVar8->m_PhysicalDevice)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
             .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
    puVar3 = (undefined8 *)CreateInfo->pCacheData;
    peVar4 = (element_type *)*puVar3;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
    pVVar6 = (VkPipelineCache_T *)puVar3[2];
    uVar7 = puVar3[3];
    local_68.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = (int)((ulong)peVar4 >> 0x20);
    bVar9 = local_68.m_pLogicalDevice.
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._4_4_ == 1;
    local_68.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    local_68.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    local_68.m_VkObject = pVVar6;
    uStack_50 = uVar7;
    if (((bVar9) &&
        (((local_68.m_pLogicalDevice.
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr._0_4_ = (int)peVar4,
          bVar9 = (int)local_68.m_pLogicalDevice.
                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr == 0x20, bVar9 &&
          (local_68.m_pLogicalDevice.
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ = (uint32_t)((ulong)p_Var5 >> 0x20),
          bVar9 = local_68.m_pLogicalDevice.
                  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._4_4_ == (pVVar2->m_Properties).deviceID, bVar9)) &&
         (local_68.m_pLogicalDevice.
          super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_4_ = (uint32_t)p_Var5,
         bVar9 = (uint32_t)
                 local_68.m_pLogicalDevice.
                 super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi == (pVVar2->m_Properties).vendorID, bVar9)))) &&
       (local_68.m_VkObject._0_1_ = (uint8_t)pVVar6,
       local_68.m_VkObject._1_1_ = (uint8_t)((ulong)pVVar6 >> 8),
       local_68.m_VkObject._2_1_ = (uint8_t)((ulong)pVVar6 >> 0x10),
       local_68.m_VkObject._3_1_ = (uint8_t)((ulong)pVVar6 >> 0x18),
       local_68.m_VkObject._4_1_ = (uint8_t)((ulong)pVVar6 >> 0x20),
       local_68.m_VkObject._5_1_ = (uint8_t)((ulong)pVVar6 >> 0x28),
       local_68.m_VkObject._6_1_ = (uint8_t)((ulong)pVVar6 >> 0x30),
       local_68.m_VkObject._7_1_ = (uint8_t)((ulong)pVVar6 >> 0x38),
       uStack_50._0_1_ = (uint8_t)uVar7, uStack_50._1_1_ = (uint8_t)((ulong)uVar7 >> 8),
       uStack_50._2_1_ = (uint8_t)((ulong)uVar7 >> 0x10),
       uStack_50._3_1_ = (uint8_t)((ulong)uVar7 >> 0x18),
       uStack_50._4_1_ = (uint8_t)((ulong)uVar7 >> 0x20),
       uStack_50._5_1_ = (uint8_t)((ulong)uVar7 >> 0x28),
       uStack_50._6_1_ = (uint8_t)((ulong)uVar7 >> 0x30),
       uStack_50._7_1_ = (uint8_t)((ulong)uVar7 >> 0x38),
       auVar10[0] = -((pVVar2->m_Properties).pipelineCacheUUID[0] == (uint8_t)local_68.m_VkObject),
       auVar10[1] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 1) ==
                     local_68.m_VkObject._1_1_),
       auVar10[2] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 2) ==
                     local_68.m_VkObject._2_1_),
       auVar10[3] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 3) ==
                     local_68.m_VkObject._3_1_),
       auVar10[4] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 4) ==
                     local_68.m_VkObject._4_1_),
       auVar10[5] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 5) ==
                     local_68.m_VkObject._5_1_),
       auVar10[6] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 6) ==
                     local_68.m_VkObject._6_1_),
       auVar10[7] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 7) ==
                     local_68.m_VkObject._7_1_),
       auVar10[8] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 8) ==
                     (uint8_t)uStack_50),
       auVar10[9] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 9) ==
                     uStack_50._1_1_),
       auVar10[10] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 10) ==
                      uStack_50._2_1_),
       auVar10[0xb] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 0xb) ==
                       uStack_50._3_1_),
       auVar10[0xc] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 0xc) ==
                       uStack_50._4_1_),
       auVar10[0xd] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 0xd) ==
                       uStack_50._5_1_),
       auVar10[0xe] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 0xe) ==
                       uStack_50._6_1_),
       auVar10[0xf] = -(*(uint8_t *)((long)(pVVar2->m_Properties).pipelineCacheUUID + 0xf) ==
                       uStack_50._7_1_),
       (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf)
       == 0xffff)) {
      local_38._8_4_ = CreateInfo->CacheDataSize;
      local_38._12_4_ = 0;
      local_28 = puVar3;
    }
  }
  VulkanUtilities::VulkanLogicalDevice::CreatePipelineCache
            (&local_68,
             (((this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
              .m_pDevice)->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(VkPipelineCacheCreateInfo *)local_48,
             (this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipelineCache_T_*,_(VulkanUtilities::VulkanHandleTypeId)22>
  ::operator=(&this->m_PipelineStateCache,&local_68);
  VulkanUtilities::VulkanObjectWrapper<VkPipelineCache_T_*,_(VulkanUtilities::VulkanHandleTypeId)22>
  ::~VulkanObjectWrapper(&local_68);
  return;
}

Assistant:

PipelineStateCacheVkImpl::PipelineStateCacheVkImpl(IReferenceCounters*                 pRefCounters,
                                                   RenderDeviceVkImpl*                 pRenderDeviceVk,
                                                   const PipelineStateCacheCreateInfo& CreateInfo) :
    // clang-format off
    TPipelineStateCacheBase
    {
        pRefCounters,
        pRenderDeviceVk,
        CreateInfo,
        false
    }
// clang-format on
{
    // Separate load/store is not supported in Vulkan.
    m_Desc.Mode |= PSO_CACHE_MODE_LOAD | PSO_CACHE_MODE_STORE;

    VkPipelineCacheCreateInfo VkPipelineStateCacheCI{};
    VkPipelineStateCacheCI.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;

    if (CreateInfo.pCacheData != nullptr && CreateInfo.CacheDataSize > sizeof(VkPipelineCacheHeaderVersionOne))
    {
        const auto& Props = GetDevice()->GetPhysicalDevice().GetProperties();

        VkPipelineCacheHeaderVersionOne HeaderVersion;
        std::memcpy(&HeaderVersion, CreateInfo.pCacheData, sizeof(HeaderVersion));

        if (HeaderVersion.headerVersion == VK_PIPELINE_CACHE_HEADER_VERSION_ONE &&
            HeaderVersion.headerSize == 32 && // from specs
            HeaderVersion.deviceID == Props.deviceID &&
            HeaderVersion.vendorID == Props.vendorID &&
            std::memcmp(HeaderVersion.pipelineCacheUUID, Props.pipelineCacheUUID, sizeof(HeaderVersion.pipelineCacheUUID)) == 0)
        {
            VkPipelineStateCacheCI.initialDataSize = CreateInfo.CacheDataSize;
            VkPipelineStateCacheCI.pInitialData    = CreateInfo.pCacheData;
        }
    }

    m_PipelineStateCache = m_pDevice->GetLogicalDevice().CreatePipelineCache(VkPipelineStateCacheCI, m_Desc.Name);
}